

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeFinalizing.cpp
# Opt level: O0

Pass * wasm::createTypeUnFinalizingPass(void)

{
  TypeFinalizing *this;
  
  this = (TypeFinalizing *)operator_new(0x98);
  anon_unknown_35::TypeFinalizing::TypeFinalizing(this,false);
  return &this->super_Pass;
}

Assistant:

Pass* createTypeUnFinalizingPass() { return new TypeFinalizing(false); }